

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariablePowerGeneralizationImpl.hpp
# Opt level: O0

void __thiscall
Inferences::VariablePowerGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *p)

{
  anon_class_8_1_c685f059 update;
  bool bVar1;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *in_RSI;
  undefined8 *in_RDI;
  FlatMeetLattice<int> current;
  Option<Kernel::Variable> var;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> factor;
  StlIter __end3;
  StlIter __begin3;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range3;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> summand;
  StlIter __end2;
  StlIter __begin2;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range2;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffea8;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffeb0;
  FlatMeetLattice<int> in_stack_fffffffffffffeb8;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffef4;
  OptionBase<Kernel::Variable> in_stack_fffffffffffffefc;
  int local_e4;
  undefined1 local_b0 [32];
  undefined1 *local_90;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_68 [3];
  undefined1 local_38 [32];
  undefined1 *local_18;
  
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>::
  operator->(in_RSI);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_fffffffffffffeb0);
  local_18 = local_38;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           *)in_stack_fffffffffffffea8);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
         *)in_stack_fffffffffffffea8);
  while (bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffeb0,
                                 (StlIter *)in_stack_fffffffffffffea8), bVar1) {
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::operator*((StlIter *)0x74612b);
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
              (in_stack_fffffffffffffec0,
               (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               in_stack_fffffffffffffeb8._inner._inner);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(local_68);
    Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::iter
              ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
               in_stack_fffffffffffffeb0);
    local_90 = local_b0;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
             *)in_stack_fffffffffffffea8);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           *)in_stack_fffffffffffffea8);
    while (bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffeb0,
                                   (StlIter *)in_stack_fffffffffffffea8), bVar1) {
      in_stack_fffffffffffffec0 =
           (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
           Lib::
           IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           ::StlIter::operator*((StlIter *)0x7461c9);
      Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactor
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      Kernel::PolyNf::tryVar((PolyNf *)in_stack_fffffffffffffeb8._inner._inner);
      bVar1 = Lib::OptionBase<Kernel::Variable>::isSome
                        ((OptionBase<Kernel::Variable> *)&stack0xfffffffffffffefc);
      if (bVar1) {
        if ((local_e4 == 0) || (local_e4 == 1)) {
          in_stack_fffffffffffffeb8 = FlatMeetLattice<int>::bot();
          in_stack_fffffffffffffef4 = in_stack_fffffffffffffeb8._inner._inner._0_4_;
        }
        else {
          FlatMeetLattice<int>::FlatMeetLattice
                    ((FlatMeetLattice<int> *)in_stack_fffffffffffffeb0,
                     (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        }
        in_stack_fffffffffffffea8 =
             (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)*in_RDI;
        in_stack_fffffffffffffeb0 =
             (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
             Lib::OptionBase<Kernel::Variable>::unwrap((OptionBase<Kernel::Variable> *)0x746253);
        update.current._4_4_ = in_stack_fffffffffffffef4;
        update.current._0_4_ =
             *(uint *)&(in_stack_fffffffffffffeb0->term).super_PolyNfSuper._inner.
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       .
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ;
        Lib::Map<Kernel::Variable,Inferences::FlatMeetLattice<int>,Lib::StlHash>::operator()
                  ((Map<Kernel::Variable,_Inferences::FlatMeetLattice<int>,_Lib::StlHash> *)
                   &stack0xfffffffffffffef4,(SymbolId)in_stack_fffffffffffffefc,update,
                   (anon_class_8_1_c685f059)&stack0xfffffffffffffef4);
      }
      Lib::Option<Kernel::Variable>::~Option((Option<Kernel::Variable> *)0x7462cf);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
      ::StlIter::operator++((StlIter *)in_stack_fffffffffffffeb0);
    }
    Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x7462f0);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<RealTraits>> p) 
  {
    for (auto summand : p->iterSummands()) {
      for (auto factor : summand.factors->iter()) {
        auto var = factor.term.tryVar();
        if (var.isSome()) {


          auto current = factor.power == 0 || factor.power == 1  /* <- power 0 should never happen. 
                                                                       power 1 yields a nop-generalization */
            ? IntLattice::bot()
            : IntLattice(factor.power);

          powers.updateOrInit(var.unwrap(),
              [&](IntLattice old) { return current.meet(old); },
              [&]() { return current; }
            );
        }
      }
    }
  }